

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5FindTokenizer(fts5_api *pApi,char *zName,void **ppUserData,fts5_tokenizer *pTokenizer)

{
  _func_void_Fts5Tokenizer_ptr *p_Var1;
  Fts5TokenizerModule *pFVar2;
  
  pFVar2 = fts5LocateTokenizer((Fts5Global *)pApi,zName);
  if (pFVar2 == (Fts5TokenizerModule *)0x0) {
    pTokenizer->xCreate = (_func_int_void_ptr_char_ptr_ptr_int_Fts5Tokenizer_ptr_ptr *)0x0;
    pTokenizer->xDelete = (_func_void_Fts5Tokenizer_ptr *)0x0;
    pTokenizer->xTokenize =
         (_func_int_Fts5Tokenizer_ptr_void_ptr_int_char_ptr_int__func_int_void_ptr_int_char_ptr_int_int_int_ptr
          *)0x0;
  }
  else {
    pTokenizer->xTokenize = (pFVar2->x).xTokenize;
    p_Var1 = (pFVar2->x).xDelete;
    pTokenizer->xCreate = (pFVar2->x).xCreate;
    pTokenizer->xDelete = p_Var1;
    *ppUserData = pFVar2->pUserData;
  }
  return (uint)(pFVar2 == (Fts5TokenizerModule *)0x0);
}

Assistant:

static int fts5FindTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void **ppUserData,
  fts5_tokenizer *pTokenizer      /* Populate this object */
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pMod;

  pMod = fts5LocateTokenizer((Fts5Global*)pApi, zName);
  if( pMod ){
    *pTokenizer = pMod->x;
    *ppUserData = pMod->pUserData;
  }else{
    memset(pTokenizer, 0, sizeof(fts5_tokenizer));
    rc = SQLITE_ERROR;
  }

  return rc;
}